

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smd.c
# Opt level: O2

int lws_smd_msg_distribute(lws_context *ctx)

{
  uint16_t *puVar1;
  lws_mutex_t *__mutex;
  lws_mutex_t *__mutex_00;
  lws_smd_peer_t *plVar2;
  lws_smd_msg_t *msg;
  bool bVar3;
  lws_log_cx *cx;
  lws_smd_msg_t *plVar4;
  lws_smd_peer_t *pr;
  bool bVar5;
  
  if ((ctx->smd).owner_messages.count != 0) {
    (ctx->smd).delivering = '\x01';
    __mutex = &(ctx->smd).lock_peers;
    __mutex_00 = &(ctx->smd).lock_messages;
    do {
      pthread_mutex_lock((pthread_mutex_t *)__mutex);
      bVar3 = false;
      pr = (lws_smd_peer_t *)(ctx->smd).owner_peers.head;
      while (pr != (lws_smd_peer_t *)0x0) {
        plVar2 = (lws_smd_peer_t *)(pr->list).next;
        msg = pr->tail;
        if (msg == (lws_smd_msg_t *)0x0) {
          bVar5 = false;
        }
        else {
          cx = lwsl_context_get_cx(ctx);
          _lws_log_cx(cx,lws_log_prepend_context,ctx,8,"_lws_smd_msg_deliver_peer",
                      "deliver cl 0x%x, len %d, refc %d, to peer %p",(ulong)msg->_class,
                      (ulong)msg->length,(ulong)msg->refcount,pr);
          (*pr->cb)(pr->opaque,msg->_class,msg->timestamp,msg + 1,(size_t)msg->length);
          if (msg->refcount == 0) {
            __assert_fail("msg->refcount",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/system/smd/smd.c"
                          ,0x21a,
                          "int _lws_smd_msg_deliver_peer(struct lws_context *, lws_smd_peer_t *)");
          }
          plVar4 = _lws_smd_msg_next_matching_filter(pr);
          pr->tail = plVar4;
          if ((plVar4 != (lws_smd_msg_t *)0x0) && ((plVar4->_class & pr->_class_filter) == 0)) {
            __assert_fail("!pr->tail || (pr->tail->_class & pr->_class_filter)",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/system/smd/smd.c"
                          ,0x223,
                          "int _lws_smd_msg_deliver_peer(struct lws_context *, lws_smd_peer_t *)");
          }
          pthread_mutex_lock((pthread_mutex_t *)__mutex_00);
          puVar1 = &msg->refcount;
          *puVar1 = *puVar1 - 1;
          if (*puVar1 == 0) {
            _lws_smd_msg_destroy(ctx,&ctx->smd,msg);
          }
          pthread_mutex_unlock((pthread_mutex_t *)__mutex_00);
          bVar5 = pr->tail != (lws_smd_msg_t *)0x0;
        }
        bVar3 = (bool)(bVar3 | bVar5);
        pr = plVar2;
      }
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    } while (bVar3);
    (ctx->smd).delivering = '\0';
  }
  return 0;
}

Assistant:

int
lws_smd_msg_distribute(struct lws_context *ctx)
{
	char more;

	/* commonly, no messages and nothing to do... */

	if (!ctx->smd.owner_messages.count)
		return 0;

	ctx->smd.delivering = 1;

	do {
		more = 0;
		lws_mutex_lock(ctx->smd.lock_peers); /* +++++++++++++++ peers */

		lws_start_foreach_dll_safe(struct lws_dll2 *, p, p1,
					   ctx->smd.owner_peers.head) {
			lws_smd_peer_t *pr = lws_container_of(p, lws_smd_peer_t, list);

			more = (char)(more | !!_lws_smd_msg_deliver_peer(ctx, pr));

		} lws_end_foreach_dll_safe(p, p1);

		lws_mutex_unlock(ctx->smd.lock_peers); /* ------------- peers */
	} while (more);

	ctx->smd.delivering = 0;

	return 0;
}